

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void emit_restart(phuff_entropy_ptr entropy,int restart_num)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  undefined4 in_ESI;
  long in_RDI;
  int ci;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  emit_eobrun((phuff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (*(int *)(in_RDI + 0x28) == 0) {
    flush_bits((phuff_entropy_ptr)0x1497b0);
    puVar1 = *(undefined1 **)(in_RDI + 0x30);
    *(undefined1 **)(in_RDI + 0x30) = puVar1 + 1;
    *puVar1 = 0xff;
    lVar3 = *(long *)(in_RDI + 0x38) + -1;
    *(long *)(in_RDI + 0x38) = lVar3;
    if (lVar3 == 0) {
      dump_buffer((phuff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    pcVar2 = *(char **)(in_RDI + 0x30);
    *(char **)(in_RDI + 0x30) = pcVar2 + 1;
    *pcVar2 = (char)in_ESI + -0x30;
    lVar3 = *(long *)(in_RDI + 0x38) + -1;
    *(long *)(in_RDI + 0x38) = lVar3;
    if (lVar3 == 0) {
      dump_buffer((phuff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
  }
  if (*(int *)(*(long *)(in_RDI + 0x50) + 0x19c) == 0) {
    for (iVar4 = 0; iVar4 < *(int *)(*(long *)(in_RDI + 0x50) + 0x144); iVar4 = iVar4 + 1) {
      *(undefined4 *)(in_RDI + 0x58 + (long)iVar4 * 4) = 0;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x6c) = 0;
    *(undefined4 *)(in_RDI + 0x70) = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_restart(j_compress_ptr cinfo, int restart_num)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci;
  jpeg_component_info *compptr;

  finish_pass(cinfo);

  emit_byte(0xFF, cinfo);
  emit_byte(JPEG_RST0 + restart_num, cinfo);

  /* Re-initialize statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->progressive_mode == 0 || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      MEMZERO(entropy->dc_stats[compptr->dc_tbl_no], DC_STAT_BINS);
      /* Reset DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->progressive_mode == 0 || cinfo->Se) {
      MEMZERO(entropy->ac_stats[compptr->ac_tbl_no], AC_STAT_BINS);
    }
  }

  /* Reset arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */
}